

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::Parallelogram::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,Parallelogram *this,RefinementPattern *ref_pat,dim_t codim)

{
  RefElType RVar1;
  RefElType RVar2;
  bool bVar3;
  size_type sVar4;
  uint uVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  size_type sVar8;
  PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *pPVar9;
  Index IVar10;
  DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *this_00;
  reference polygon;
  string local_1188;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  stringstream local_1118 [8];
  stringstream ss_7;
  ostream local_1108 [376];
  undefined1 local_f90 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_f88;
  string local_f80;
  allocator<char> local_f59;
  string local_f58;
  allocator<char> local_f31;
  string local_f30;
  stringstream local_f10 [8];
  stringstream ss_6;
  ostream local_f00 [376];
  undefined1 local_d88 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_d80;
  string local_d78;
  allocator<char> local_d51;
  string local_d50;
  allocator<char> local_d29;
  string local_d28;
  stringstream local_d08 [8];
  stringstream ss_5;
  ostream local_cf8 [376];
  string local_b80;
  allocator<char> local_b59;
  string local_b58;
  allocator<char> local_b31;
  string local_b30;
  stringstream local_b10 [8];
  stringstream ss_4;
  ostream local_b00 [376];
  undefined1 local_988 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_980;
  undefined1 local_978 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_970;
  undefined1 local_968 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_960;
  Type local_958;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_948;
  Matrix<double,__1,__1,_0,__1,__1> local_910;
  undefined1 local_8f8 [8];
  MatrixXd child_geo;
  allocator<char> local_8b9;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  stringstream local_870 [8];
  stringstream ss_3;
  ostream local_860 [376];
  uint local_6e8;
  undefined1 local_6e2;
  allocator<char> local_6e1;
  int l;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  stringstream local_600 [8];
  stringstream ss_2;
  ostream local_5f0 [380];
  uint local_474;
  undefined1 local_470 [4];
  size_type no_children;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygons;
  double h_lattice;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  stringstream local_3e0 [8];
  stringstream ss_1;
  ostream local_3d0 [376];
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  RefEl local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [378];
  RefEl local_26;
  RefEl local_25;
  dim_t local_24;
  RefinementPattern *pRStack_20;
  dim_t codim_local;
  RefinementPattern *ref_pat_local;
  Parallelogram *this_local;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *child_geo_uptrs;
  
  local_24 = codim;
  pRStack_20 = ref_pat;
  ref_pat_local = (RefinementPattern *)this;
  this_local = (Parallelogram *)__return_storage_ptr__;
  local_25 = RefinementPattern::RefEl(ref_pat);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_25);
  local_26 = lf::base::RefEl::kQuad();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_26);
  if (RVar1 != RVar2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar6 = std::operator<<(local_1a0,"Refinement pattern for ");
    local_1e1 = RefinementPattern::RefEl(pRStack_20);
    lf::base::RefEl::ToString_abi_cxx11_(&local_1e0,&local_1e1);
    std::operator<<(poVar6,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"ref_pat.RefEl() == lf::base::RefEl::kQuad()",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_231);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_208,&local_230,0x163,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (2 < local_24) {
    std::__cxx11::stringstream::stringstream(local_3e0);
    poVar6 = std::operator<<(local_3d0,"Illegal codim ");
    std::ostream::operator<<(poVar6,local_24);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"codim < 3",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_429);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_400,&local_428,0x166,(string *)&h_lattice);
    std::__cxx11::string::~string((string *)&h_lattice);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar4 = RefinementPattern::LatticeConst(pRStack_20);
  child_polygons.
  super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(1.0 / (double)sVar4);
  (*pRStack_20->_vptr_RefinementPattern[1])
            ((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
              *)local_470,pRStack_20,(ulong)local_24);
  sVar8 = std::
          vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
          ::size((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                  *)local_470);
  local_474 = (uint)sVar8;
  uVar5 = (**pRStack_20->_vptr_RefinementPattern)();
  if ((uint)sVar8 != uVar5) {
    std::__cxx11::stringstream::stringstream(local_600);
    poVar6 = std::operator<<(local_5f0,"no_children = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_474);
    poVar6 = std::operator<<(poVar6," <-> ");
    uVar5 = (**pRStack_20->_vptr_RefinementPattern)(pRStack_20,(ulong)local_24);
    std::ostream::operator<<(poVar6,uVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_620,"no_children == ref_pat.NumChildren(codim)",&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_648,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_649);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_620,&local_648,0x172,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"false",&local_691);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_6b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&l,"",&local_6e1);
    lf::base::AssertionFailed(&local_690,&local_6b8,0x172,(string *)&l);
    std::__cxx11::string::~string((string *)&l);
    std::allocator<char>::~allocator(&local_6e1);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator(&local_6b9);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    abort();
  }
  local_6e2 = 0;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::vector(__return_storage_ptr__);
  local_6e8 = 0;
  do {
    if (local_474 <= local_6e8) {
      local_6e2 = 1;
      std::
      vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 *)local_470);
      return __return_storage_ptr__;
    }
    pPVar9 = &std::
              vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            *)local_470,(long)(int)local_6e8)->
              super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
    IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar9);
    if (IVar10 != 2) {
      std::__cxx11::stringstream::stringstream(local_870);
      poVar6 = std::operator<<(local_860,"child_polygons[");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_6e8);
      poVar6 = std::operator<<(poVar6,"].rows() = ");
      pPVar9 = &std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)local_470,(long)(int)local_6e8)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
      IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar9);
      std::ostream::operator<<(poVar6,IVar10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_890,"child_polygons[l].rows() == 2",&local_891);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_8b9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed
                (&local_890,&local_8b8,0x17c,
                 (string *)
                 &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols);
      std::__cxx11::string::~string
                ((string *)
                 &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::allocator<char>::~allocator(&local_8b9);
      std::__cxx11::string::~string((string *)&local_890);
      std::allocator<char>::~allocator(&local_891);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"this code should not be reached");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)
              std::
              vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            *)local_470,(long)(int)local_6e8);
    Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>(&local_958,this_00);
    Eigen::operator*(&local_948,
                     (double *)
                     &child_polygons.
                      super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (StorageBaseType *)&local_958);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_910,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                *)&local_948);
    (*(this->super_Geometry)._vptr_Geometry[3])(local_8f8,this,&local_910);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_910);
    if (local_24 == 0) {
      pPVar9 = &std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)local_470,(long)(int)local_6e8)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
      IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
      if (IVar10 == 3) {
        std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_968);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_960,
                   (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
                   local_968);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_960);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_960);
        std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
        ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
                    local_968);
      }
      else {
        pPVar9 = &std::
                  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                  ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                *)local_470,(long)(int)local_6e8)->
                  super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
        if (IVar10 != 4) {
          std::__cxx11::stringstream::stringstream(local_b10);
          poVar6 = std::operator<<(local_b00,"child_polygons[");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_6e8);
          poVar6 = std::operator<<(poVar6,"].cols() = ");
          pPVar9 = &std::
                    vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                    ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                  *)local_470,(long)(int)local_6e8)->
                    super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
          IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
          std::ostream::operator<<(poVar6,IVar10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b30,"false",&local_b31);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b58,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                     ,&local_b59);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_b30,&local_b58,0x198,&local_b80);
          std::__cxx11::string::~string((string *)&local_b80);
          std::__cxx11::string::~string((string *)&local_b58);
          std::allocator<char>::~allocator(&local_b59);
          std::__cxx11::string::~string((string *)&local_b30);
          std::allocator<char>::~allocator(&local_b31);
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"this code should not be reached");
          __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        polygon = std::
                  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                  ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                *)local_470,(long)(int)local_6e8);
        bVar3 = isParallelogram(polygon);
        if (bVar3) {
          std::make_unique<lf::geometry::Parallelogram,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_978);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::Parallelogram,std::default_delete<lf::geometry::Parallelogram>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_970,
                     (unique_ptr<lf::geometry::Parallelogram,_std::default_delete<lf::geometry::Parallelogram>_>
                      *)local_978);
          std::
          vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&local_970);
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_970);
          std::
          unique_ptr<lf::geometry::Parallelogram,_std::default_delete<lf::geometry::Parallelogram>_>
          ::~unique_ptr((unique_ptr<lf::geometry::Parallelogram,_std::default_delete<lf::geometry::Parallelogram>_>
                         *)local_978);
        }
        else {
          std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_988);
          std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
          unique_ptr<lf::geometry::QuadO1,std::default_delete<lf::geometry::QuadO1>,void>
                    ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>
                      *)&local_980,
                     (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *
                     )local_988);
          std::
          vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
          ::push_back(__return_storage_ptr__,(value_type *)&local_980);
          std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
          ~unique_ptr(&local_980);
          std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::
          ~unique_ptr((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>
                       *)local_988);
        }
      }
    }
    else if (local_24 == 1) {
      pPVar9 = &std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)local_470,(long)(int)local_6e8)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
      IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
      if (IVar10 != 2) {
        std::__cxx11::stringstream::stringstream(local_d08);
        poVar6 = std::operator<<(local_cf8,"child_polygons[l].cols() = ");
        pPVar9 = &std::
                  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                  ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                *)local_470,(long)(int)local_6e8)->
                  super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
        std::ostream::operator<<(poVar6,IVar10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d28,"child_polygons[l].cols() == 2",&local_d29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d50,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_d51);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_d28,&local_d50,0x1a0,&local_d78);
        std::__cxx11::string::~string((string *)&local_d78);
        std::__cxx11::string::~string((string *)&local_d50);
        std::allocator<char>::~allocator(&local_d51);
        std::__cxx11::string::~string((string *)&local_d28);
        std::allocator<char>::~allocator(&local_d29);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_d88);
      std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
      unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
                ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
                 &local_d80,
                 (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                  *)local_d88);
      std::
      vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_d80);
      std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
      ~unique_ptr(&local_d80);
      std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
      ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                   *)local_d88);
    }
    else {
      if (local_24 != 2) {
        std::__cxx11::stringstream::stringstream(local_1118);
        std::operator<<(local_1108,"Illegal co-dimension");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1138,"false",&local_1139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1160,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_1161);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_1138,&local_1160,0x1ac,&local_1188);
        std::__cxx11::string::~string((string *)&local_1188);
        std::__cxx11::string::~string((string *)&local_1160);
        std::allocator<char>::~allocator(&local_1161);
        std::__cxx11::string::~string((string *)&local_1138);
        std::allocator<char>::~allocator(&local_1139);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pPVar9 = &std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)local_470,(long)(int)local_6e8)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
      IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
      if (IVar10 != 1) {
        std::__cxx11::stringstream::stringstream(local_f10);
        poVar6 = std::operator<<(local_f00,"child_polygons[l].cols() = ");
        pPVar9 = &std::
                  vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                  ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                                *)local_470,(long)(int)local_6e8)->
                  super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
        IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
        std::ostream::operator<<(poVar6,IVar10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f30,"child_polygons[l].cols() == 1",&local_f31);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f58,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_f59);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_f30,&local_f58,0x1a7,&local_f80);
        std::__cxx11::string::~string((string *)&local_f80);
        std::__cxx11::string::~string((string *)&local_f58);
        std::allocator<char>::~allocator(&local_f59);
        std::__cxx11::string::~string((string *)&local_f30);
        std::allocator<char>::~allocator(&local_f31);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_f90);
      std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
      unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
                ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
                 &local_f88,
                 (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                 local_f90);
      std::
      vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_f88);
      std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
      ~unique_ptr(&local_f88);
      std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
                ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                 local_f90);
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_8f8);
    local_6e8 = local_6e8 + 1;
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<Geometry>> Parallelogram::ChildGeometry(
    const RefinementPattern& ref_pat, lf::base::dim_t codim) const {
  // The refinement pattern must be for a quadrilateral
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kQuad(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  // Allowed condimensions:
  // 0 -> child cells, 1-> child edges, 2 -> child points
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);

  // Lattice meshwidth
  const double h_lattice = 1.0 / static_cast<double>(ref_pat.LatticeConst());
  // Obtain geometry of children as lattice polygons
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
      child_polygons(ref_pat.ChildPolygons(codim));
  // Number of child segments
  const base::size_type no_children = child_polygons.size();
  // Check consistency of data
  LF_ASSERT_MSG(
      no_children == ref_pat.NumChildren(codim),
      "no_children = " << no_children << " <-> " << ref_pat.NumChildren(codim));

  // Variable for returning (unique pointers to) child geometries
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};
  // For each child entity create a geometry object and a unique pointer to it.
  for (int l = 0; l < no_children; l++) {
    // A single child entity is described by a lattice polygon with
    // a certain number of corners
    LF_VERIFY_MSG(
        child_polygons[l].rows() == 2,
        "child_polygons[" << l << "].rows() = " << child_polygons[l].rows());
    // Obtain physical (world) coordinates of the vertices of
    // of the child entities after normalizing lattice coordinates
    const Eigen::MatrixXd child_geo(
        Global(h_lattice * child_polygons[l].cast<double>()));
    // Treat child entities of different dimension
    switch (codim) {
      case 0: {  // Child cells
        if (child_polygons[l].cols() == 3) {
          // Child cell is a triangle
          child_geo_uptrs.push_back(std::make_unique<TriaO1>(child_geo));
        } else if (child_polygons[l].cols() == 4) {
          // Child cell is a quadrilateral
          ////////////////////////////////////////////////////
          // Code specific for a parallleogram
          // If the lattice polygon is a parallelogram
          // then create another parallelogram, otherwise
          // a general quadrilateral
          if (isParallelogram(child_polygons[l])) {
            // Child cell is parallelogram as well
            child_geo_uptrs.push_back(
                std::make_unique<Parallelogram>(child_geo));
          } else {
            // General quadrilateral
            child_geo_uptrs.push_back(std::make_unique<QuadO1>(child_geo));
          }
        } else {
          LF_VERIFY_MSG(false, "child_polygons[" << l << "].cols() = "
                                                 << child_polygons[l].cols());
        }
        break;
      }
      case 1: {
        // Child is an edge
        LF_VERIFY_MSG(
            child_polygons[l].cols() == 2,
            "child_polygons[l].cols() = " << child_polygons[l].cols());
        child_geo_uptrs.push_back(std::make_unique<SegmentO1>(child_geo));
        break;
      }
      case 2: {
        LF_VERIFY_MSG(
            child_polygons[l].cols() == 1,
            "child_polygons[l].cols() = " << child_polygons[l].cols());
        child_geo_uptrs.push_back(std::make_unique<Point>(child_geo));
        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
        break;
      }
    }  // end switch codim
  }  // end loop over children
  return (child_geo_uptrs);
}